

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

Instr * __thiscall
Inline::InsertInlineeBuiltInStartEndTags
          (Inline *this,Instr *callInstr,uint actualCount,Instr **builtinStartInstr)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  Instr *pIVar5;
  undefined4 *puVar6;
  Opnd *pOVar7;
  IntConstOpnd *this_00;
  
  pIVar5 = IR::Instr::New(InlineBuiltInStart,callInstr->m_func);
  pOVar7 = callInstr->m_src1;
  if (pIVar5->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0054f9a9;
    *puVar6 = 0;
  }
  pFVar1 = pIVar5->m_func;
  if (pOVar7->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_0054f9a9;
    *puVar6 = 0;
  }
  bVar4 = pOVar7->field_0xb;
  if ((bVar4 & 2) != 0) {
    pOVar7 = IR::Opnd::Copy(pOVar7,pFVar1);
    bVar4 = pOVar7->field_0xb;
  }
  pOVar7->field_0xb = bVar4 | 2;
  pIVar5->m_src1 = pOVar7;
  pOVar7 = callInstr->m_src2;
  if (pIVar5->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0054f9a9;
    *puVar6 = 0;
  }
  pFVar1 = pIVar5->m_func;
  if (pOVar7->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_0054f9a9;
    *puVar6 = 0;
  }
  bVar4 = pOVar7->field_0xb;
  if ((bVar4 & 2) != 0) {
    pOVar7 = IR::Opnd::Copy(pOVar7,pFVar1);
    bVar4 = pOVar7->field_0xb;
  }
  pOVar7->field_0xb = bVar4 | 2;
  pIVar5->m_src2 = pOVar7;
  IR::Instr::SetByteCodeOffset(pIVar5,callInstr);
  IR::Instr::InsertBefore(callInstr,pIVar5);
  if (builtinStartInstr != (Instr **)0x0) {
    *builtinStartInstr = pIVar5;
  }
  pIVar5 = IR::Instr::New(InlineBuiltInEnd,callInstr->m_func);
  this_00 = IR::IntConstOpnd::New((ulong)actualCount,TyInt32,callInstr->m_func,false);
  if (pIVar5->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0054f9a9;
    *puVar6 = 0;
  }
  pFVar1 = pIVar5->m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_0054f9a9;
    *puVar6 = 0;
  }
  bVar4 = (this_00->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_00 = (IntConstOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
    bVar4 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar4 | 2;
  pIVar5->m_src1 = &this_00->super_Opnd;
  pOVar7 = callInstr->m_src2;
  if (pIVar5->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0054f9a9;
    *puVar6 = 0;
  }
  pFVar1 = pIVar5->m_func;
  if (pOVar7->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_0054f9a9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  bVar4 = pOVar7->field_0xb;
  if ((bVar4 & 2) != 0) {
    pOVar7 = IR::Opnd::Copy(pOVar7,pFVar1);
    bVar4 = pOVar7->field_0xb;
  }
  pOVar7->field_0xb = bVar4 | 2;
  pIVar5->m_src2 = pOVar7;
  IR::Instr::SetByteCodeOffset(pIVar5,callInstr);
  IR::Instr::InsertAfter(callInstr,pIVar5);
  return pIVar5;
}

Assistant:

IR::Instr* Inline::InsertInlineeBuiltInStartEndTags(IR::Instr* callInstr, uint actualCount, IR::Instr** builtinStartInstr)
{
    IR::Instr* inlineBuiltInStartInstr = IR::Instr::New(Js::OpCode::InlineBuiltInStart, callInstr->m_func);
    inlineBuiltInStartInstr->SetSrc1(callInstr->GetSrc1());
    inlineBuiltInStartInstr->SetSrc2(callInstr->GetSrc2());
    inlineBuiltInStartInstr->SetByteCodeOffset(callInstr);
    callInstr->InsertBefore(inlineBuiltInStartInstr);
    if (builtinStartInstr)
    {
        *builtinStartInstr = inlineBuiltInStartInstr;
    }

    IR::Instr* inlineBuiltInEndInstr = IR::Instr::New(Js::OpCode::InlineBuiltInEnd, callInstr->m_func);
    inlineBuiltInEndInstr->SetSrc1(IR::IntConstOpnd::New(actualCount, TyInt32, callInstr->m_func));
    inlineBuiltInEndInstr->SetSrc2(callInstr->GetSrc2());
    inlineBuiltInEndInstr->SetByteCodeOffset(callInstr);
    callInstr->InsertAfter(inlineBuiltInEndInstr);
    return inlineBuiltInEndInstr;
}